

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O0

json_object * __thiscall
json_deserializer::deserialize_json_object
          (json_object *__return_storage_ptr__,json_deserializer *this)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_json_str_*>_>::value,_pair<iterator,_bool>_>
  _Var4;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_json_null_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_json_number_*>_>::value,_pair<iterator,_bool>_>
  _Var6;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_json_array_*>_>::value,_pair<iterator,_bool>_>
  _Var7;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_json_bool_*>_>::value,_pair<iterator,_bool>_>
  _Var8;
  json_object *local_4f8;
  string local_4f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_object_*>
  local_4d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
  local_4a8;
  undefined1 local_478 [8];
  json_object jsonObject;
  json_bool *local_430;
  string local_428;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_bool_*>
  local_408;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
  local_3e0;
  undefined1 local_3b0 [8];
  json_bool jsonBool_1;
  json_bool *local_390;
  string local_388;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_bool_*>
  local_368;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
  local_340;
  undefined1 local_310 [8];
  json_bool jsonBool;
  json_array *local_2f0;
  string local_2e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_array_*>
  local_2c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
  local_2a0;
  undefined1 local_270 [8];
  json_array jsonArray;
  json_number *local_240;
  string local_238;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_number_*>
  local_218;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
  local_1f0;
  undefined1 local_1c0 [8];
  json_number jsonNumber;
  json_null *local_1a0;
  string local_198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_null_*>
  local_178;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
  local_150;
  undefined1 local_120 [8];
  json_null jsonNull;
  undefined1 local_108 [8];
  string local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_str_*>
  local_e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
  local_b8;
  undefined1 local_88 [8];
  json_str jsonStr;
  undefined1 local_58 [7];
  char current;
  json_str key;
  json_deserializer *this_local;
  json_object *obj;
  
  json_object::json_object(__return_storage_ptr__);
  do {
    json_reader::next(&this->reader);
    cVar1 = json_reader::current(&this->reader);
    if (cVar1 == '}') {
      return __return_storage_ptr__;
    }
    deserialize_str((json_str *)local_58,this);
    do {
      bVar2 = json_reader::next(&this->reader);
      if (!bVar2) goto LAB_00147cc8;
      jsonStr.value.field_2._M_local_buf[0xf] = json_reader::current(&this->reader);
    } while (jsonStr.value.field_2._M_local_buf[0xf] != ':');
    json_reader::next(&this->reader);
LAB_00147cc8:
    uVar3 = current_deserialization_type(this);
    if ((uVar3 & 2) == 0) {
      uVar3 = current_deserialization_type(this);
      if ((uVar3 & 1) == 0) {
        uVar3 = current_deserialization_type(this);
        if ((uVar3 & 4) == 0) {
          uVar3 = current_deserialization_type(this);
          if ((uVar3 & 0x10) == 0) {
            uVar3 = current_deserialization_type(this);
            if ((uVar3 & 8) == 0) {
              uVar3 = current_deserialization_type(this);
              if ((uVar3 & 0x20) != 0) {
                deserialize_json_object((json_object *)local_478,this);
                json_object::kvmap_abi_cxx11_(&local_4a8,__return_storage_ptr__);
                json_str::str_value_abi_cxx11_(&local_4f0,(json_str *)local_58);
                local_4f8 = (json_object *)local_478;
                std::make_pair<std::__cxx11::string,json_object*>(&local_4d0,&local_4f0,&local_4f8);
                std::
                map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                ::insert<std::pair<std::__cxx11::string,json_object*>>
                          ((map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                            *)&local_4a8,&local_4d0);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_object_*>
                ::~pair(&local_4d0);
                std::__cxx11::string::~string((string *)&local_4f0);
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                ::~map(&local_4a8);
                json_object::~json_object((json_object *)local_478);
              }
            }
            else {
              uVar3 = current_deserialization_type(this);
              if ((uVar3 & 0x40) == 0) {
                uVar3 = current_deserialization_type(this);
                if ((uVar3 & 0x80) != 0) {
                  deserialize_bool_false((json_deserializer *)local_3b0);
                  json_object::kvmap_abi_cxx11_(&local_3e0,__return_storage_ptr__);
                  json_str::str_value_abi_cxx11_(&local_428,(json_str *)local_58);
                  local_430 = (json_bool *)local_3b0;
                  std::make_pair<std::__cxx11::string,json_bool*>(&local_408,&local_428,&local_430);
                  _Var8 = std::
                          map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                          ::insert<std::pair<std::__cxx11::string,json_bool*>>
                                    ((map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                                      *)&local_3e0,&local_408);
                  jsonObject.map._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       (size_t)_Var8.first._M_node;
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_bool_*>
                  ::~pair(&local_408);
                  std::__cxx11::string::~string((string *)&local_428);
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                  ::~map(&local_3e0);
                }
              }
              else {
                deserialize_bool_true((json_deserializer *)local_310);
                json_object::kvmap_abi_cxx11_(&local_340,__return_storage_ptr__);
                json_str::str_value_abi_cxx11_(&local_388,(json_str *)local_58);
                local_390 = (json_bool *)local_310;
                std::make_pair<std::__cxx11::string,json_bool*>(&local_368,&local_388,&local_390);
                _Var8 = std::
                        map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                        ::insert<std::pair<std::__cxx11::string,json_bool*>>
                                  ((map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                                    *)&local_340,&local_368);
                jsonBool_1._8_8_ = _Var8.first._M_node;
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_bool_*>
                ::~pair(&local_368);
                std::__cxx11::string::~string((string *)&local_388);
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
                ::~map(&local_340);
              }
            }
          }
          else {
            deserialize_array((json_array *)local_270,this);
            json_object::kvmap_abi_cxx11_(&local_2a0,__return_storage_ptr__);
            json_str::str_value_abi_cxx11_(&local_2e8,(json_str *)local_58);
            local_2f0 = (json_array *)local_270;
            std::make_pair<std::__cxx11::string,json_array*>(&local_2c8,&local_2e8,&local_2f0);
            _Var7 = std::
                    map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                    ::insert<std::pair<std::__cxx11::string,json_array*>>
                              ((map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                                *)&local_2a0,&local_2c8);
            jsonBool._8_8_ = _Var7.first._M_node;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_array_*>
            ::~pair(&local_2c8);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
            ::~map(&local_2a0);
            json_array::~json_array((json_array *)local_270);
          }
        }
        else {
          deserialize_number((json_deserializer *)local_1c0);
          json_object::kvmap_abi_cxx11_(&local_1f0,__return_storage_ptr__);
          json_str::str_value_abi_cxx11_(&local_238,(json_str *)local_58);
          local_240 = (json_number *)local_1c0;
          std::make_pair<std::__cxx11::string,json_number*>(&local_218,&local_238,&local_240);
          _Var6 = std::
                  map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                  ::insert<std::pair<std::__cxx11::string,json_number*>>
                            ((map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                              *)&local_1f0,&local_218);
          jsonArray.values.super__Vector_base<json_element_*,_std::allocator<json_element_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Var6.first._M_node;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_number_*>
          ::~pair(&local_218);
          std::__cxx11::string::~string((string *)&local_238);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
          ::~map(&local_1f0);
        }
      }
      else {
        deserialize_null((json_deserializer *)local_120);
        json_object::kvmap_abi_cxx11_(&local_150,__return_storage_ptr__);
        json_str::str_value_abi_cxx11_(&local_198,(json_str *)local_58);
        local_1a0 = (json_null *)local_120;
        std::make_pair<std::__cxx11::string,json_null*>(&local_178,&local_198,&local_1a0);
        _Var5 = std::
                map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                ::insert<std::pair<std::__cxx11::string,json_null*>>
                          ((map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                            *)&local_150,&local_178);
        jsonNumber.value = (double)_Var5.first._M_node;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_null_*>
        ::~pair(&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
        ::~map(&local_150);
      }
    }
    else {
      deserialize_str((json_str *)local_88,this);
      json_object::kvmap_abi_cxx11_(&local_b8,__return_storage_ptr__);
      json_str::str_value_abi_cxx11_((string *)(local_108 + 8),(json_str *)local_58);
      local_108 = (undefined1  [8])local_88;
      std::make_pair<std::__cxx11::string,json_str*>
                (&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_108 + 8),(json_str **)local_108);
      _Var4 = std::
              map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
              ::insert<std::pair<std::__cxx11::string,json_str*>>
                        ((map<std::__cxx11::string,json_element*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,json_element*>>>
                          *)&local_b8,&local_e0);
      jsonNull.super_json_element._vptr_json_element = (json_element)_Var4.first._M_node;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_str_*>
      ::~pair(&local_e0);
      std::__cxx11::string::~string((string *)(local_108 + 8));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json_element_*>_>_>
      ::~map(&local_b8);
      json_str::~json_str((json_str *)local_88);
    }
    json_reader::next(&this->reader);
    cVar1 = json_reader::current(&this->reader);
    if (cVar1 == '}') {
      key.value.field_2._8_4_ = 3;
    }
    else {
      key.value.field_2._8_4_ = 0;
    }
    json_str::~json_str((json_str *)local_58);
    if (key.value.field_2._8_4_ != 0) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

json_object deserialize_json_object() {
        json_object obj;

        while(true) {
            reader.next();

            if (reader.current() == closing_object) {
                return obj;
            }

            json_str key = deserialize_str();

            while (reader.next()) {
                char current = reader.current();
                if (current == ':') {
                    reader.next();
                    break;
                }
            }

            if ((current_deserialization_type() & g_json_str) != 0) {
                json_str jsonStr = deserialize_str();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonStr));
            } else if ((current_deserialization_type() & g_json_null) != 0) {
                json_null jsonNull = deserialize_null();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonNull));
            } else if ((current_deserialization_type() & g_json_number) != 0) {
                json_number jsonNumber = deserialize_number();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonNumber));
            } else if ((current_deserialization_type() & g_json_array) != 0) {
                json_array jsonArray = deserialize_array();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonArray));
            } else if ((current_deserialization_type() & g_json_bool) != 0) {
                if ((current_deserialization_type() & g_json_true) != 0) {
                    json_bool jsonBool = deserialize_bool_true();
                    obj.kvmap().insert(make_pair(key.str_value(), &jsonBool));
                } else if ((current_deserialization_type() & g_json_false) != 0) {
                    json_bool jsonBool = deserialize_bool_false();
                    obj.kvmap().insert(make_pair(key.str_value(), &jsonBool));
                }
            } else if ((current_deserialization_type() & g_json_object) != 0) {
                json_object jsonObject = deserialize_json_object();
                obj.kvmap().insert(make_pair(key.str_value(), &jsonObject));
            }

            reader.next();

            if (reader.current() == closing_object) {
                break;
            }
        }

        return obj;
    }